

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O1

int find_relro_boundary(dl_phdr_info *info,size_t size,void *data)

{
  Elf64_Phdr *pEVar1;
  int iVar2;
  Boundary *boundary;
  long lVar3;
  long lVar4;
  
  if ((ulong)info->dlpi_phnum == 0) {
    return 0;
  }
  pEVar1 = info->dlpi_phdr;
  lVar3 = (ulong)info->dlpi_phnum * 0x38;
  lVar4 = 0;
  while (((*(int *)((long)&pEVar1->p_type + lVar4) != 1 ||
          (iVar2 = strcmp(*data,info->dlpi_name), iVar2 != 0)) ||
         (*(Elf64_Addr *)((long)data + 8) != info->dlpi_addr))) {
    lVar4 = lVar4 + 0x38;
    if (lVar3 - lVar4 == 0) {
      return 0;
    }
  }
  lVar4 = 0;
  do {
    if (*(int *)((long)&pEVar1->p_type + lVar4) == 0x6474e552) {
      lVar3 = *(Elf64_Addr *)((long)data + 8) + *(long *)((long)&pEVar1->p_vaddr + lVar4);
      *(long *)((long)data + 0x10) = lVar3;
      *(long *)((long)data + 0x18) = lVar3 + *(long *)((long)&pEVar1->p_memsz + lVar4);
      *(undefined4 *)((long)data + 0x20) = 1;
      return 1;
    }
    lVar4 = lVar4 + 0x38;
  } while (lVar3 - lVar4 != 0);
  return 0;
}

Assistant:

int find_relro_boundary(struct dl_phdr_info *info, size_t size, void *data) {
  struct Boundary *boundary = data;
  int found = 0;
  for (int i = 0; i < info->dlpi_phnum; ++i) {
    if (info->dlpi_phdr[i].p_type == PT_LOAD) {
      if (strcmp(boundary->l_name, info->dlpi_name) == 0 &&
          boundary->load_addr == info->dlpi_addr) {
        found = 1;
        break;
      }
    }
  }
  if (found) {
    for (int i = 0; i < info->dlpi_phnum; ++i) {
      if (info->dlpi_phdr[i].p_type == PT_GNU_RELRO) {
        boundary->start_addr = boundary->load_addr + info->dlpi_phdr[i].p_vaddr;
        boundary->end_addr = boundary->start_addr + info->dlpi_phdr[i].p_memsz;
        boundary->found = 1;
        return 1;
      }
    }
  }
  return 0;
}